

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm.cpp
# Opt level: O2

int __thiscall ncnn::LayerNorm::forward_inplace(LayerNorm *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  void *pvVar6;
  void *pvVar7;
  size_t sVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int j_2;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  void *pvVar15;
  int j_6;
  int j_4;
  ulong uVar16;
  float fVar17;
  undefined1 in_XMM1 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  undefined1 in_XMM5 [16];
  undefined1 auVar21 [16];
  
  iVar1 = bottom_top_blob->dims;
  auVar21._4_12_ = in_XMM1._4_12_;
  if (iVar1 == 3) {
    uVar2 = bottom_top_blob->w;
    uVar9 = bottom_top_blob->h;
    uVar3 = bottom_top_blob->c;
    if (this->affine_size == uVar2) {
      uVar13 = 0;
      uVar11 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar11 = uVar13;
      }
      uVar10 = (ulong)uVar9;
      if ((int)uVar9 < 1) {
        uVar10 = uVar13;
      }
      uVar14 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar14 = uVar13;
      }
      for (; uVar13 != uVar14; uVar13 = uVar13 + 1) {
        iVar1 = bottom_top_blob->w;
        sVar5 = bottom_top_blob->elemsize;
        iVar4 = this->affine;
        pvVar15 = (void *)(sVar5 * bottom_top_blob->cstep * uVar13 + (long)bottom_top_blob->data);
        for (uVar12 = 0; uVar12 != uVar10; uVar12 = uVar12 + 1) {
          fVar17 = 0.0;
          for (uVar16 = 0; uVar11 != uVar16; uVar16 = uVar16 + 1) {
            fVar17 = fVar17 + *(float *)((long)pvVar15 + uVar16 * 4);
          }
          fVar17 = fVar17 * (1.0 / (float)(int)uVar2);
          fVar19 = 0.0;
          for (uVar16 = 0; uVar11 != uVar16; uVar16 = uVar16 + 1) {
            fVar20 = *(float *)((long)pvVar15 + uVar16 * 4) - fVar17;
            fVar20 = fVar20 * fVar20;
            in_XMM5 = ZEXT416((uint)fVar20);
            fVar19 = fVar19 + fVar20;
          }
          fVar20 = fVar19 * (1.0 / (float)(int)uVar2) + this->eps;
          auVar21 = rsqrtss(in_XMM5,ZEXT416((uint)fVar20));
          fVar19 = auVar21._0_4_;
          in_XMM5._4_12_ = auVar21._4_12_;
          in_XMM5._0_4_ = fVar19 * -0.5 * (fVar20 * fVar19 * fVar19 + -3.0);
          fVar17 = -fVar17 * in_XMM5._0_4_;
          if (iVar4 == 0) {
            for (uVar16 = 0; uVar11 != uVar16; uVar16 = uVar16 + 1) {
              *(float *)((long)pvVar15 + uVar16 * 4) =
                   *(float *)((long)pvVar15 + uVar16 * 4) * in_XMM5._0_4_ + fVar17;
            }
          }
          else {
            pvVar6 = (this->gamma_data).data;
            pvVar7 = (this->beta_data).data;
            for (uVar16 = 0; uVar11 != uVar16; uVar16 = uVar16 + 1) {
              *(float *)((long)pvVar15 + uVar16 * 4) =
                   (*(float *)((long)pvVar15 + uVar16 * 4) * in_XMM5._0_4_ + fVar17) *
                   *(float *)((long)pvVar6 + uVar16 * 4) + *(float *)((long)pvVar7 + uVar16 * 4);
            }
          }
          pvVar15 = (void *)((long)pvVar15 + (long)iVar1 * sVar5);
        }
      }
    }
    else {
      uVar9 = uVar9 * uVar2;
      pvVar15 = bottom_top_blob->data;
      uVar13 = 0;
      uVar11 = (ulong)uVar9;
      if ((int)uVar9 < 1) {
        uVar11 = uVar13;
      }
      sVar5 = bottom_top_blob->cstep;
      uVar10 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar10 = uVar13;
      }
      iVar1 = this->affine;
      sVar8 = bottom_top_blob->elemsize;
      for (; uVar13 != uVar10; uVar13 = uVar13 + 1) {
        fVar17 = 0.0;
        for (uVar14 = 0; uVar11 != uVar14; uVar14 = uVar14 + 1) {
          fVar17 = fVar17 + *(float *)((long)pvVar15 + uVar14 * 4);
        }
        fVar17 = fVar17 * (1.0 / (float)(int)uVar9);
        fVar19 = 0.0;
        for (uVar14 = 0; uVar11 != uVar14; uVar14 = uVar14 + 1) {
          fVar20 = *(float *)((long)pvVar15 + uVar14 * 4) - fVar17;
          fVar20 = fVar20 * fVar20;
          in_XMM5 = ZEXT416((uint)fVar20);
          fVar19 = fVar19 + fVar20;
        }
        fVar20 = fVar19 * (1.0 / (float)(int)uVar9) + this->eps;
        auVar21 = rsqrtss(in_XMM5,ZEXT416((uint)fVar20));
        fVar19 = auVar21._0_4_;
        in_XMM5._4_12_ = auVar21._4_12_;
        in_XMM5._0_4_ = fVar19 * -0.5 * (fVar20 * fVar19 * fVar19 + -3.0);
        fVar17 = -fVar17 * in_XMM5._0_4_;
        if (iVar1 == 0) {
          for (uVar14 = 0; uVar11 != uVar14; uVar14 = uVar14 + 1) {
            *(float *)((long)pvVar15 + uVar14 * 4) =
                 *(float *)((long)pvVar15 + uVar14 * 4) * in_XMM5._0_4_ + fVar17;
          }
        }
        else {
          pvVar6 = (this->gamma_data).data;
          pvVar7 = (this->beta_data).data;
          for (uVar14 = 0; uVar11 != uVar14; uVar14 = uVar14 + 1) {
            *(float *)((long)pvVar15 + uVar14 * 4) =
                 (*(float *)((long)pvVar15 + uVar14 * 4) * in_XMM5._0_4_ + fVar17) *
                 *(float *)((long)pvVar6 + uVar14 * 4) + *(float *)((long)pvVar7 + uVar14 * 4);
          }
        }
        pvVar15 = (void *)((long)pvVar15 + sVar5 * sVar8);
      }
    }
  }
  else if (iVar1 == 2) {
    uVar2 = bottom_top_blob->w;
    uVar11 = 0;
    uVar13 = 0;
    if (0 < (int)uVar2) {
      uVar13 = (ulong)uVar2;
    }
    pvVar15 = bottom_top_blob->data;
    uVar10 = (ulong)(uint)bottom_top_blob->h;
    if (bottom_top_blob->h < 1) {
      uVar10 = uVar11;
    }
    iVar1 = this->affine;
    sVar5 = bottom_top_blob->elemsize;
    for (; uVar11 != uVar10; uVar11 = uVar11 + 1) {
      fVar17 = 0.0;
      for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
        fVar17 = fVar17 + *(float *)((long)pvVar15 + uVar14 * 4);
      }
      fVar17 = fVar17 * (1.0 / (float)(int)uVar2);
      fVar19 = 0.0;
      for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
        fVar20 = *(float *)((long)pvVar15 + uVar14 * 4) - fVar17;
        fVar20 = fVar20 * fVar20;
        in_XMM5 = ZEXT416((uint)fVar20);
        fVar19 = fVar19 + fVar20;
      }
      fVar20 = fVar19 * (1.0 / (float)(int)uVar2) + this->eps;
      auVar21 = rsqrtss(in_XMM5,ZEXT416((uint)fVar20));
      fVar19 = auVar21._0_4_;
      in_XMM5._4_12_ = auVar21._4_12_;
      in_XMM5._0_4_ = fVar19 * -0.5 * (fVar20 * fVar19 * fVar19 + -3.0);
      fVar17 = -fVar17 * in_XMM5._0_4_;
      if (iVar1 == 0) {
        for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
          *(float *)((long)pvVar15 + uVar14 * 4) =
               *(float *)((long)pvVar15 + uVar14 * 4) * in_XMM5._0_4_ + fVar17;
        }
      }
      else {
        pvVar6 = (this->gamma_data).data;
        pvVar7 = (this->beta_data).data;
        for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
          *(float *)((long)pvVar15 + uVar14 * 4) =
               (*(float *)((long)pvVar15 + uVar14 * 4) * in_XMM5._0_4_ + fVar17) *
               *(float *)((long)pvVar6 + uVar14 * 4) + *(float *)((long)pvVar7 + uVar14 * 4);
        }
      }
      pvVar15 = (void *)((long)pvVar15 + (long)(int)uVar2 * sVar5);
    }
  }
  else if (iVar1 == 1) {
    uVar2 = bottom_top_blob->w;
    pvVar15 = bottom_top_blob->data;
    uVar13 = 0;
    uVar11 = 0;
    if (0 < (int)uVar2) {
      uVar11 = (ulong)uVar2;
    }
    fVar17 = 0.0;
    for (; uVar11 != uVar13; uVar13 = uVar13 + 1) {
      fVar17 = fVar17 + *(float *)((long)pvVar15 + uVar13 * 4);
    }
    auVar21._0_4_ = (float)(int)uVar2;
    fVar19 = 0.0;
    for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
      fVar20 = *(float *)((long)pvVar15 + uVar13 * 4) - fVar17 / auVar21._0_4_;
      fVar19 = fVar19 + fVar20 * fVar20;
    }
    fVar20 = fVar19 / auVar21._0_4_ + this->eps;
    auVar18 = rsqrtss(auVar21,ZEXT416((uint)fVar20));
    fVar19 = auVar18._0_4_;
    fVar19 = fVar19 * -0.5 * (fVar20 * fVar19 * fVar19 + -3.0);
    fVar17 = -(fVar17 / auVar21._0_4_) * fVar19;
    if (this->affine == 0) {
      for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
        *(float *)((long)pvVar15 + uVar13 * 4) =
             *(float *)((long)pvVar15 + uVar13 * 4) * fVar19 + fVar17;
      }
    }
    else {
      pvVar6 = (this->gamma_data).data;
      pvVar7 = (this->beta_data).data;
      for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
        *(float *)((long)pvVar15 + uVar13 * 4) =
             (*(float *)((long)pvVar15 + uVar13 * 4) * fVar19 + fVar17) *
             *(float *)((long)pvVar6 + uVar13 * 4) + *(float *)((long)pvVar7 + uVar13 * 4);
      }
    }
  }
  return 0;
}

Assistant:

int LayerNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // x = (x - mean) / sqrt(var + eps) * gamma + beta

    int dims = bottom_top_blob.dims;

    if (dims == 1)
    {
        int w = bottom_top_blob.w;
        // assert affine_size == w

        float* ptr = bottom_top_blob;

        // mean and var
        float sum = 0.f;
        float sqsum = 0.f;
        for (int i = 0; i < w; i++)
        {
            sum += ptr[i];
            //sqsum += ptr[i] * ptr[i];
        }
        float mean = sum / w;
        float tmp = 0.f;
        for (int i = 0; i < w; i++)
        {
            tmp = ptr[i] - mean;
            sqsum += tmp * tmp;
        }
        float var = sqsum / w;
        // the var maybe minus due to accuracy
        //float var = sqsum / w - mean * mean;

        float a = static_cast<float>(1.f / (sqrt(var + eps)));
        float b = -mean * a;

        if (affine)
        {
            for (int i = 0; i < w; i++)
            {
                ptr[i] = (ptr[i] * a + b) * gamma_data[i] + beta_data[i];
            }
        }
        else
        {
            for (int i = 0; i < w; i++)
            {
                ptr[i] = ptr[i] * a + b;
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        // assert affine_size == w

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);

            // mean and var
            float sum = 0.f;
            float sqsum = 0.f;
            for (int j = 0; j < w; j++)
            {
                sum += ptr[j];
                //sqsum += ptr[j] * ptr[j];
            }
            float mean = sum / w;
            float tmp = 0.f;
            for (int j = 0; j < w; j++)
            {
                tmp = ptr[j] - mean;
                sqsum += tmp * tmp;
            }
            float var = sqsum / w;
            // the var maybe minus due to accuracy
            //float var = sqsum / w - mean * mean;

            float a = static_cast<float>(1.f / (sqrt(var + eps)));
            float b = -mean * a;

            if (affine)
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = (ptr[j] * a + b) * gamma_data[j] + beta_data[j];
                }
            }
            else
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = ptr[j] * a + b;
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        if (affine_size == w)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.channel(q).row(i);

                    // mean and var
                    float sum = 0.f;
                    float sqsum = 0.f;
                    for (int j = 0; j < w; j++)
                    {
                        sum += ptr[j];
                        //sqsum += ptr[j] * ptr[j];
                    }
                    float mean = sum / w;
                    float tmp = 0.f;
                    for (int j = 0; j < w; j++)
                    {
                        tmp = ptr[j] - mean;
                        sqsum += tmp * tmp;
                    }
                    float var = sqsum / w;
                    // the var maybe minus due to accuracy
                    //float var = sqsum / w - mean * mean;

                    float a = static_cast<float>(1.f / (sqrt(var + eps)));
                    float b = -mean * a;

                    if (affine)
                    {
                        for (int j = 0; j < w; j++)
                        {
                            ptr[j] = (ptr[j] * a + b) * gamma_data[j] + beta_data[j];
                        }
                    }
                    else
                    {
                        for (int j = 0; j < w; j++)
                        {
                            ptr[j] = ptr[j] * a + b;
                        }
                    }
                }
            }
        }
        else // if (affine_size == size)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                // mean and var
                float sum = 0.f;
                float sqsum = 0.f;
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                    //sqsum += ptr[i] * ptr[i];
                }
                float mean = sum / size;
                float tmp = 0.f;
                for (int i = 0; i < size; i++)
                {
                    tmp = ptr[i] - mean;
                    sqsum += tmp * tmp;
                }
                float var = sqsum / size;
                // the var maybe minus due to accuracy
                //float var = sqsum / size - mean * mean;

                float a = static_cast<float>(1.f / (sqrt(var + eps)));
                float b = -mean * a;

                if (affine)
                {
                    for (int i = 0; i < size; i++)
                    {
                        ptr[i] = (ptr[i] * a + b) * gamma_data[i] + beta_data[i];
                    }
                }
                else
                {
                    for (int i = 0; i < size; i++)
                    {
                        ptr[i] = ptr[i] * a + b;
                    }
                }
            }
        }
    }

    return 0;
}